

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O2

void __thiscall
my_algorithm::WeightedDigraphSPDijkstra<int,_int>::_relax
          (WeightedDigraphSPDijkstra<int,_int> *this,WeightedDigraph<int,_int> *graph,
          SPElement *element)

{
  SymbolTable<int,_int> *this_00;
  PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_01;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar4;
  ulong uVar5;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *edge;
  pointer value;
  int to_vertex;
  int new_weight;
  PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> local_74;
  int vertex;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  edges;
  
  vertex = element->vertex;
  local_74._list._vptr_LinkedList._0_4_ = element->weight;
  pRVar4 = data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getNode
                     (&(graph->super_WeightedGraph<int,_int>)._tree,&vertex);
  data_structures::
  SymbolTable<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::values(&edges,&(pRVar4->element).value._table);
  local_74._list._20_8_ =
       edges.
       super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->_weight_to;
  local_74._list._4_8_ = &this->_edge_to;
  this_01 = &this->_queue;
  value = edges.
          super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_74._list._12_8_ = this;
  do {
    if (value == (pointer)local_74._list._20_8_) {
      std::
      _Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ::~_Vector_base(&edges.
                       super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     );
      return;
    }
    to_vertex = (value->to->element).key;
    new_weight = value->weight + (int)local_74._list._vptr_LinkedList;
    bVar2 = data_structures::SymbolTable<int,_int>::has(this_00,&to_vertex);
    if (bVar2) {
      iVar3 = data_structures::SymbolTable<int,_int>::get(this_00,&to_vertex);
      if (new_weight < iVar3) {
        data_structures::SymbolTable<int,_int>::set(this_00,&to_vertex,&new_weight);
        data_structures::
        SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
        ::set((SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
               *)local_74._list._4_8_,&to_vertex,value);
        uVar1 = (((PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
                 (local_74._list._12_8_ + 0x60))->_list)._size;
        for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
          data_structures::
          PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::minN
                    (&local_74,(size_t)this_01);
          if ((int)local_74._vptr_PriorityQueue == to_vertex) {
            data_structures::
            PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::dequeueMinN
                      (&local_74,(size_t)this_01);
            break;
          }
        }
        local_74._vptr_PriorityQueue._0_4_ = to_vertex;
        local_74._vptr_PriorityQueue._4_4_ = new_weight;
        data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>
        ::enqueue(this_01,(SPElement *)&local_74);
      }
    }
    else {
      data_structures::SymbolTable<int,_int>::set(this_00,&to_vertex,&new_weight);
      data_structures::
      SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
      ::set((SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
             *)local_74._list._4_8_,&to_vertex,value);
      local_74._vptr_PriorityQueue._0_4_ = to_vertex;
      local_74._vptr_PriorityQueue._4_4_ = new_weight;
      data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
      enqueue(this_01,(SPElement *)&local_74);
    }
    value = value + 1;
  } while( true );
}

Assistant:

void _relax(WeightedDigraph<T, Weight> &graph, const SPElement& element) {
            auto vertex = element.vertex;
            auto weight = element.weight;
            auto node = graph.getNode(vertex);
            auto edges = node->element.value.adjEdges();
            for (auto &edge: edges) {
                auto to_vertex = edge.to->element.key;
                auto new_weight = weight + edge.weight;
                if (!_weight_to.has(to_vertex)) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                    _queue.enqueue(SPElement(to_vertex, new_weight));
                    continue;
                }
                if (_weight_to.get(to_vertex) > new_weight) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                    // todo: create a new priority queue which supports method `change`
                    auto size = _queue.size();
                    for (size_t i = 1; i <= size; i++) {
                        if (_queue.minN(i).vertex == to_vertex) {
                            _queue.dequeueMinN(i);
                            break;
                        }
                    }
                    _queue.enqueue(SPElement(to_vertex, new_weight));
                }
            }
        }